

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTextureSwizzleTests.cpp
# Opt level: O3

IterateResult __thiscall gl3cts::TextureSwizzle::APIErrorsTest::iterate(APIErrorsTest *this)

{
  undefined4 uVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  GLenum state;
  long lVar5;
  size_t i;
  long lVar6;
  GLint param [4];
  deUint32 local_48 [6];
  long lVar4;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar4 + 0x6f8))(1,&this->m_id);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"GenTextures",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0x898);
  (**(code **)(lVar4 + 0xb8))(0x8513,this->m_id);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"BindTexture",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTextureSwizzleTests.cpp"
                  ,0x89b);
  lVar6 = 0;
  do {
    uVar1 = (&states)[lVar6];
    lVar5 = 0;
    do {
      (**(code **)(lVar4 + 0x1360))(0x8513,uVar1,*(undefined4 *)((long)&valid_values + lVar5));
      verifyError(this,0);
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0x18);
    lVar5 = 0;
    do {
      (**(code **)(lVar4 + 0x1360))
                (0x8513,uVar1,*(undefined4 *)((long)iterate::invalid_values + lVar5));
      verifyError(this,0x500);
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0x10);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  lVar6 = 0;
  do {
    lVar5 = 0;
    do {
      local_48[0] = 0x1903;
      local_48[1] = 0x1904;
      local_48[2] = 0x1905;
      local_48[3] = 0x1906;
      local_48[lVar6] = *(deUint32 *)((long)&valid_values + lVar5);
      (**(code **)(lVar4 + 0x1368))(0x8513,0x8e46,local_48);
      verifyError(this,0);
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0x18);
    lVar5 = 0;
    do {
      local_48[0] = 0x1903;
      local_48[1] = 0x1904;
      local_48[2] = 0x1905;
      local_48[3] = 0x1906;
      local_48[lVar6] = *(deUint32 *)((long)iterate::invalid_values + lVar5);
      (**(code **)(lVar4 + 0x1368))(0x8513,0x8e46,local_48);
      verifyError(this,0x500);
      lVar5 = lVar5 + 4;
    } while (lVar5 != 0x10);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 4);
  tcu::TestContext::setTestResult
            (((this->super_TestCase).m_context)->m_testCtx,QP_TEST_RESULT_PASS,"Pass");
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult APIErrorsTest::iterate()
{
	static const glw::GLint invalid_values[] = { 0x1902, 0x1907, -1, 2 };
	static const size_t		n_invalid_values = sizeof(invalid_values) / sizeof(invalid_values[0]);

	/*  */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.genTextures(1, &m_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenTextures");

	gl.bindTexture(GL_TEXTURE_CUBE_MAP, m_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "BindTexture");

	/*
	 * - INVALID_ENUM is generated by TexParameter* routines when <pname> is
	 * one of [TEXTURE_SWIZZLE_R, TEXTURE_SWIZZLE_G, TEXTURE_SWIZZLE_B,
	 * TEXTURE_SWIZZLE_A] and <param> is not one of [RED, GREEN, BLUE, ALPHA, ZERO,
	 * ONE];
	 */
	for (size_t i = 0; i < n_states; ++i)
	{
		for (size_t j = 0; j < n_valid_values; ++j)
		{
			const glw::GLenum state = states[i];
			const glw::GLint  value = valid_values[j];

			gl.texParameteri(GL_TEXTURE_CUBE_MAP, state, value);
			verifyError(GL_NO_ERROR);
		}

		for (size_t j = 0; j < n_invalid_values; ++j)
		{
			const glw::GLenum state = states[i];
			const glw::GLint  value = invalid_values[j];

			gl.texParameteri(GL_TEXTURE_CUBE_MAP, state, value);
			verifyError(GL_INVALID_ENUM);
		}
	}

	/*
	 * - INVALID_ENUM is generated by TexParameter*v routines when <pname> is
	 * TEXTURE_SWIZZLE_RGBA and any of four values pointed by <param> is not one of
	 * [RED, GREEN, BLUE, ALPHA, ZERO, ONE].
	 */
	for (size_t i = 0; i < 4 /* number of channels */; ++i)
	{
		for (size_t j = 0; j < n_valid_values; ++j)
		{
			const glw::GLint value = valid_values[j];

			glw::GLint param[4] = { GL_RED, GL_GREEN, GL_BLUE, GL_ALPHA };

			param[i] = value;

			gl.texParameteriv(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_SWIZZLE_RGBA, param);
			verifyError(GL_NO_ERROR);
		}

		for (size_t j = 0; j < n_invalid_values; ++j)
		{
			const glw::GLint value = invalid_values[j];

			glw::GLint param[4] = { GL_RED, GL_GREEN, GL_BLUE, GL_ALPHA };

			param[i] = value;

			gl.texParameteriv(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_SWIZZLE_RGBA, param);
			verifyError(GL_INVALID_ENUM);
		}
	}

	/* Set result - exceptions are thrown in case of any error */
	m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

	/* Done */
	return STOP;
}